

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_private.hh
# Opt level: O1

void QPDF::Writer::optimize
               (QPDF *qpdf,ObjTable *obj,function<int_(QPDFObjectHandle_&)> *skip_stream_parameters)

{
  _Any_data _Stack_38;
  _Manager_type local_28;
  
  std::function<int_(QPDFObjectHandle_&)>::function
            ((function<int_(QPDFObjectHandle_&)> *)&_Stack_38,skip_stream_parameters);
  QPDF::optimize(qpdf,obj,(function<int_(QPDFObjectHandle_&)> *)&_Stack_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&_Stack_38,&_Stack_38,__destroy_functor);
  }
  return;
}

Assistant:

static void
    optimize(
        QPDF& qpdf,
        QPDFWriter::ObjTable const& obj,
        std::function<int(QPDFObjectHandle&)> skip_stream_parameters)
    {
        qpdf.optimize(obj, skip_stream_parameters);
    }